

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTestListener.cpp
# Opt level: O3

unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_> __thiscall
rc::detail::makeDefaultTestListener(detail *this,Configuration *config,ostream *os)

{
  bool bVar1;
  bool bVar2;
  LogTestListener *this_00;
  ReproduceListener *this_01;
  MulticastTestListener *this_02;
  Listeners listeners;
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  local_68;
  Listeners local_48;
  
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = config->verboseProgress;
  bVar2 = config->verboseShrinking;
  this_00 = (LogTestListener *)operator_new(0x18);
  LogTestListener::LogTestListener(this_00,os,(bool)(bVar1 & 1),(bool)(bVar2 & 1));
  local_48.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  std::
  vector<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>,std::allocator<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>>
  ::
  emplace_back<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>
            ((vector<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>,std::allocator<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>>
              *)&local_68,
             (unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_> *
             )&local_48);
  if ((LogTestListener *)
      local_48.
      super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (LogTestListener *)0x0) {
    (*((TestListener *)
      &(local_48.
        super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t)->_vptr_TestListener[4])();
  }
  this_01 = (ReproduceListener *)operator_new(0x48);
  ReproduceListener::ReproduceListener(this_01,os);
  local_48.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
  std::
  vector<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>,std::allocator<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>>
  ::
  emplace_back<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>
            ((vector<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>,std::allocator<std::unique_ptr<rc::detail::TestListener,std::default_delete<rc::detail::TestListener>>>>
              *)&local_68,
             (unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_> *
             )&local_48);
  if ((ReproduceListener *)
      local_48.
      super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (ReproduceListener *)0x0) {
    (*(((TestListenerAdapter *)
       &(local_48.
         super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t)->super_TestListener)._vptr_TestListener
      [4])();
  }
  this_02 = (MulticastTestListener *)operator_new(0x20);
  local_48.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MulticastTestListener::MulticastTestListener(this_02,&local_48);
  *(MulticastTestListener **)this = this_02;
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>,_std::allocator<std::unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>_>_>
  ::~vector(&local_68);
  return (__uniq_ptr_data<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>,_true,_true>
          )(__uniq_ptr_data<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TestListener>
makeDefaultTestListener(const Configuration &config, std::ostream &os) {
  MulticastTestListener::Listeners listeners;
  listeners.push_back(makeListener<LogTestListener>(
      os, config.verboseProgress, config.verboseShrinking));
  listeners.push_back(makeListener<ReproduceListener>(os));
  return makeListener<MulticastTestListener>(std::move(listeners));
}